

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.cc
# Opt level: O2

ostream * __thiscall pstack::Flags::dump(Flags *this,ostream *os)

{
  long *plVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  option *opt;
  long *plVar4;
  
  plVar1 = *(long **)(this + 8);
  for (plVar4 = *(long **)this; plVar4 != plVar1; plVar4 = plVar4 + 4) {
    if (*plVar4 != 0) {
      pmVar2 = std::
               map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
               ::at((map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
                     *)(this + 0x18),(key_type *)(plVar4 + 3));
      std::operator<<(os,"    [");
      if (0 < (int)plVar4[3]) {
        poVar3 = std::operator<<(os,"-");
        poVar3 = std::operator<<(poVar3,(char)plVar4[3]);
        std::operator<<(poVar3,"|");
      }
      poVar3 = std::operator<<(os,"--");
      std::operator<<(poVar3,(char *)*plVar4);
      if ((int)plVar4[1] != 0) {
        poVar3 = std::operator<<(os," <");
        poVar3 = std::operator<<(poVar3,pmVar2->metavar);
        std::operator<<(poVar3,">");
      }
      poVar3 = std::operator<<(os,"]\n        ");
      poVar3 = std::operator<<(poVar3,pmVar2->helptext);
      std::operator<<(poVar3,"\n");
    }
  }
  return os;
}

Assistant:

std::ostream &
Flags::dump(std::ostream &os) const
{
    for (const auto &opt  : longOptions) {
        if (opt.name == nullptr)
            continue;
        const auto &datum = data.at(opt.val);
        os << "    [";
        if (opt.val > 0)
           os << "-" << char(opt.val) << "|";
        os << "--" << opt.name;
        if (opt.has_arg != 0)
            os << " <" << datum.metavar << ">";
        os << "]\n        " << datum.helptext << "\n";
    }
    return os;
}